

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_live_fetching.c
# Opt level: O3

int main(void)

{
  aspa_array *paVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  aspa_record *paVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  rtr_mgr_config *conf;
  rtr_socket rtr_tcp;
  tr_socket tr_tcp;
  char RPKI_CACHE_PORT [5];
  rtr_mgr_group groups [1];
  char RPKI_CACHE_HOST [22];
  rtr_mgr_config *local_170;
  rtr_socket local_168;
  tr_tcp_config local_e8;
  tr_socket local_b8;
  char local_80 [8];
  rtr_mgr_group local_78;
  char local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8.host = local_58;
  builtin_strncpy(local_58,"rtrlab.tanneberger.me",0x16);
  local_e8.port = local_80;
  builtin_strncpy(local_80,"3325",5);
  local_e8.bindaddr = (char *)0x0;
  local_e8.data._0_4_ = 0;
  local_e8.data._4_4_ = 0;
  local_e8.new_socket._0_4_ = 0;
  local_e8._36_8_ = 0;
  tr_tcp_init(&local_e8,&local_b8);
  local_168.tr_socket = &local_b8;
  local_78.sockets = (rtr_socket **)malloc(8);
  local_78.sockets_len = 1;
  *local_78.sockets = &local_168;
  local_78.preference = '\x01';
  iVar8 = 1;
  iVar4 = rtr_mgr_init(&local_170,&local_78,1,connection_status_callback,(void *)0x0);
  if (-1 < iVar4) {
    iVar4 = rtr_mgr_add_roa_support(local_170,(pfx_update_fp)0x0);
    if (iVar4 == -1) {
      main_cold_1();
    }
    iVar4 = rtr_mgr_add_aspa_support(local_170,(aspa_update_fp)0x0);
    if (iVar4 == -1) {
      main_cold_2();
    }
    iVar4 = rtr_mgr_add_spki_support(local_170,(spki_update_fp)0x0);
    if (iVar4 == -1) {
      main_cold_3();
    }
    rtr_mgr_setup_sockets(local_170,&local_78,1,0x32,600,600);
    rtr_mgr_start(local_170);
    iVar4 = 0x14;
    iVar8 = 1;
    do {
      _Var3 = rtr_mgr_conf_in_sync(local_170);
      if (_Var3) {
        paVar1 = (*local_78.sockets)->aspa_table->store->aspa_array;
        puts("ASPA:");
        if (paVar1->size != 0) {
          uVar7 = 0;
          do {
            printf("CAS %u => [ ",(ulong)paVar1->data[uVar7].customer_asn);
            paVar5 = paVar1->data;
            if (paVar5[uVar7].provider_count != 0) {
              uVar9 = 0;
              uVar10 = 1;
              do {
                printf("%u",(ulong)paVar5[uVar7].provider_asns[uVar9]);
                paVar5 = paVar1->data;
                uVar6 = paVar5[uVar7].provider_count;
                if (uVar9 < uVar6 - 1) {
                  printf(", ");
                  paVar5 = paVar1->data;
                  uVar6 = paVar5[uVar7].provider_count;
                }
                bVar2 = uVar10 < uVar6;
                uVar9 = uVar10;
                uVar10 = (ulong)((int)uVar10 + 1);
              } while (bVar2);
            }
            puts(" ]");
            uVar7 = uVar7 + 1;
          } while (uVar7 < paVar1->size);
        }
        rtr_mgr_stop(local_170);
        rtr_mgr_free(local_170);
        iVar8 = 0;
        break;
      }
      if (connection_status == RTR_MGR_ERROR) {
        iVar8 = 1;
        break;
      }
      sleep(1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

int main(void)
{
	/* These variables are not in the global scope
	 * because it would cause warnings about discarding constness
	 */

	//char RPKI_CACHE_HOST[] = "rpki-validator.realmv6.org";
	//char RPKI_CACHE_PORT[] = "8283";

	// REPLACE THIS BY YOUR RTR SERVER
	char RPKI_CACHE_HOST[] = "rtrlab.tanneberger.me";
	char RPKI_CACHE_PORT[] = "3325"; // rir rtr
	//char RPKI_CACHE_PORT[] = "3324"; // aspa rtr

	/* create a TCP transport socket */
	struct tr_socket tr_tcp;
	struct tr_tcp_config tcp_config = {RPKI_CACHE_HOST, RPKI_CACHE_PORT, NULL, NULL, NULL, 0};
	struct rtr_socket rtr_tcp;
	struct rtr_mgr_group groups[1];

	/* init a TCP transport and create rtr socket */
	tr_tcp_init(&tcp_config, &tr_tcp);
	rtr_tcp.tr_socket = &tr_tcp;

	/* create a rtr_mgr_group array with 1 element */
	groups[0].sockets = malloc(1 * sizeof(struct rtr_socket *));
	groups[0].sockets_len = 1;
	groups[0].sockets[0] = &rtr_tcp;
	groups[0].preference = 1;

	struct rtr_mgr_config *conf;

	if (rtr_mgr_init(&conf, groups, 1, &connection_status_callback, NULL) < 0)
		return EXIT_FAILURE;

	if (rtr_mgr_add_roa_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ROA support\n");
	}

	if (rtr_mgr_add_aspa_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ASPA support\n");
	}

	if (rtr_mgr_add_spki_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing BGPSEC support\n");
	}

	rtr_mgr_setup_sockets(conf, groups, 1, 50, 600, 600);
	rtr_mgr_start(conf);
	int sleep_counter = 0;
	/* wait for connection, or timeout and exit eventually */
	while (!rtr_mgr_conf_in_sync(conf)) {
		if (connection_status == RTR_MGR_ERROR)
			return EXIT_FAILURE;

		sleep(1);
		sleep_counter++;
		if (sleep_counter >= connection_timeout)
			return EXIT_FAILURE;
	}

	/* printing all fetched objects */
	struct aspa_array *array = ((*groups[0].sockets)->aspa_table->store)->aspa_array;

	printf("ASPA:\n");
	for (uint32_t i = 0; i < array->size; i++) {
		printf("CAS %u => [ ", array->data[i].customer_asn);
		for (uint32_t j = 0; j < array->data[i].provider_count; j++) {
			printf("%u", array->data[i].provider_asns[j]);
			if (j < array->data[i].provider_count - 1)
				printf(", ");
		}
		printf(" ]\n");
	}

	rtr_mgr_stop(conf);
	rtr_mgr_free(conf);

	return EXIT_SUCCESS;
}